

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> * __thiscall
kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::operator=
          (Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this,
          Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *other)

{
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *other_local;
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (FieldInfo *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }